

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O0

int pkey_gost_mac_signctx_init(EVP_PKEY_CTX *ctx,EVP_MD_CTX *mctx)

{
  void *pvVar1;
  EVP_PKEY_CTX *in_RSI;
  EVP_PKEY_CTX *in_RDI;
  gost_mac_pmeth_data *data;
  char *in_stack_ffffffffffffffd8;
  uint local_4;
  
  pvVar1 = EVP_PKEY_CTX_get_data(in_RDI);
  if (pvVar1 == (void *)0x0) {
    pkey_gost_mac_init(in_RSI);
  }
  pvVar1 = EVP_PKEY_CTX_get_data(in_RDI);
  if (pvVar1 == (void *)0x0) {
    ERR_GOST_error(0,0,in_stack_ffffffffffffffd8,0);
  }
  local_4 = (uint)(pvVar1 != (void *)0x0);
  return local_4;
}

Assistant:

static int pkey_gost_mac_signctx_init(EVP_PKEY_CTX *ctx, EVP_MD_CTX *mctx)
{
    struct gost_mac_pmeth_data *data = EVP_PKEY_CTX_get_data(ctx);

    if (data == NULL) {
        pkey_gost_mac_init(ctx);
    }

    data = EVP_PKEY_CTX_get_data(ctx);
    if (!data) {
        GOSTerr(GOST_F_PKEY_GOST_MAC_SIGNCTX_INIT, GOST_R_MAC_KEY_NOT_SET);
        return 0;
    }

    return 1;
}